

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CutoffGroup.hpp
# Opt level: O2

RealType __thiscall OpenMD::CutoffGroup::getMass(CutoffGroup *this)

{
  pointer ppAVar1;
  pointer ppAVar2;
  Atom *pAVar3;
  RealType RVar4;
  
  if (this->haveTotalMass == true) {
    return this->totalMass;
  }
  this->totalMass = 0.0;
  ppAVar2 = (this->cutoffAtomList).
            super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppAVar1 = (this->cutoffAtomList).
            super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  RVar4 = 0.0;
  if (ppAVar2 != ppAVar1) goto LAB_0012ea36;
  pAVar3 = (Atom *)0x0;
  while (pAVar3 != (Atom *)0x0) {
    RVar4 = RVar4 + (pAVar3->super_StuntDouble).mass_;
    this->totalMass = RVar4;
    ppAVar2 = ppAVar2 + 1;
    pAVar3 = (Atom *)0x0;
    if (ppAVar2 != ppAVar1) {
LAB_0012ea36:
      pAVar3 = *ppAVar2;
    }
  }
  this->haveTotalMass = true;
  return RVar4;
}

Assistant:

RealType getMass() {
      if (!haveTotalMass) {
        totalMass = 0.0;

        std::vector<Atom*>::iterator i;
        for (Atom* atom = beginAtom(i); atom != NULL; atom = nextAtom(i)) {
          RealType mass = atom->getMass();
          totalMass += mass;
        }

        haveTotalMass = true;
      }

      return totalMass;
    }